

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void BrotliStoreHuffmanTree
               (uint8_t *depths,size_t num,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  uint8_t code_length_bitdepth [18];
  size_t huffman_tree_size;
  uint32_t huffman_tree_histogram [18];
  uint16_t code_length_bitdepth_symbols [18];
  uint8_t huffman_tree_extra_bits [704];
  uint8_t huffman_tree [704];
  byte local_658 [24];
  size_t local_640;
  uint32_t local_638 [20];
  uint16_t local_5e8 [24];
  byte local_5b8 [704];
  byte local_2f8 [712];
  
  local_640 = 0;
  local_658[0] = 0;
  local_658[1] = 0;
  local_658[2] = 0;
  local_658[3] = 0;
  local_658[4] = 0;
  local_658[5] = 0;
  local_658[6] = 0;
  local_658[7] = 0;
  local_658[8] = 0;
  local_658[9] = 0;
  local_658[10] = 0;
  local_658[0xb] = 0;
  local_658[0xc] = 0;
  local_658[0xd] = 0;
  local_658[0xe] = 0;
  local_658[0xf] = 0;
  local_658[0x10] = 0;
  local_658[0x11] = 0;
  local_638[0x10] = 0;
  local_638[0x11] = 0;
  local_638[0xc] = 0;
  local_638[0xd] = 0;
  local_638[0xe] = 0;
  local_638[0xf] = 0;
  local_638[8] = 0;
  local_638[9] = 0;
  local_638[10] = 0;
  local_638[0xb] = 0;
  local_638[4] = 0;
  local_638[5] = 0;
  local_638[6] = 0;
  local_638[7] = 0;
  local_638[0] = 0;
  local_638[1] = 0;
  local_638[2] = 0;
  local_638[3] = 0;
  if (0x2c0 < num) {
    __assert_fail("num <= BROTLI_NUM_COMMAND_SYMBOLS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                  ,0x13a,
                  "void BrotliStoreHuffmanTree(const uint8_t *, size_t, HuffmanTree *, size_t *, uint8_t *)"
                 );
  }
  BrotliWriteHuffmanTree(depths,num,&local_640,local_2f8,local_5b8);
  if (local_640 != 0) {
    sVar4 = 0;
    do {
      local_638[local_2f8[sVar4]] = local_638[local_2f8[sVar4]] + 1;
      sVar4 = sVar4 + 1;
    } while (local_640 != sVar4);
  }
  lVar5 = 0;
  uVar7 = 0;
  lVar10 = 0;
  do {
    lVar2 = lVar5;
    if ((local_638[lVar10] != 0) && (bVar12 = uVar7 != 0, uVar7 = 1, lVar2 = lVar10, bVar12)) {
      uVar7 = 2;
      break;
    }
    lVar5 = lVar2;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x12);
  uVar11 = 0x12;
  BrotliCreateHuffmanTree(local_638,0x12,5,tree,local_658);
  BrotliConvertBitDepthsToSymbols(local_658,0x12,local_5e8);
  if (1 < uVar7) {
    uVar11 = 0x12;
    do {
      if (local_658[*(byte *)((long)kStaticDistanceCodeBits + uVar11 + 0x7f)] != 0)
      goto LAB_00115270;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    uVar11 = 0;
  }
LAB_00115270:
  uVar6 = (ulong)(local_658[3] == '\0') + 2;
  if (local_658[2] != '\0' || local_658[1] != '\0') {
    uVar6 = 0;
  }
  uVar8 = *storage_ix;
  *(ulong *)(storage + (uVar8 >> 3)) = uVar6 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
  uVar8 = uVar8 + 2;
  *storage_ix = uVar8;
  if (uVar6 < uVar11) {
    do {
      bVar3 = *(byte *)((long)&
                              BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kHuffmanBitLengthHuffmanCodeBitLengths
                       + (ulong)local_658[(byte)(&
                                                BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder
                                                )[uVar6]]);
      bVar1 = *(byte *)((long)&
                              BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kHuffmanBitLengthHuffmanCodeSymbols
                       + (ulong)local_658[(byte)(&
                                                BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder
                                                )[uVar6]]);
      if (bVar1 >> (bVar3 & 0x3f) != 0) goto LAB_001153fa;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)bVar1 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      uVar8 = uVar8 + bVar3;
      *storage_ix = uVar8;
      uVar6 = uVar6 + 1;
    } while (uVar11 != uVar6);
  }
  if (uVar7 == 1) {
    local_658[lVar5] = 0;
  }
  if (local_640 != 0) {
    sVar4 = *storage_ix;
    sVar9 = 0;
    do {
      bVar3 = local_2f8[sVar9];
      bVar1 = local_658[bVar3];
      if (local_5e8[bVar3] >> (bVar1 & 0x3f) != 0) {
LAB_001153fa:
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (sVar4 >> 3)) =
           (ulong)local_5e8[bVar3] << ((byte)sVar4 & 7) | (ulong)storage[sVar4 >> 3];
      sVar4 = bVar1 + sVar4;
      *storage_ix = sVar4;
      if (bVar3 == 0x11) {
        bVar3 = local_5b8[sVar9];
        lVar10 = 3;
        if (7 < bVar3) goto LAB_001153fa;
LAB_001153b4:
        *(ulong *)(storage + (sVar4 >> 3)) =
             (ulong)bVar3 << ((byte)sVar4 & 7) | (ulong)storage[sVar4 >> 3];
        sVar4 = sVar4 + lVar10;
        *storage_ix = sVar4;
      }
      else if (bVar3 == 0x10) {
        bVar3 = local_5b8[sVar9];
        lVar10 = 2;
        if (bVar3 < 4) goto LAB_001153b4;
        goto LAB_001153fa;
      }
      sVar9 = sVar9 + 1;
    } while (local_640 != sVar9);
  }
  return;
}

Assistant:

void BrotliStoreHuffmanTree(const uint8_t* depths, size_t num,
                            HuffmanTree* tree,
                            size_t *storage_ix, uint8_t *storage) {
  /* Write the Huffman tree into the brotli-representation.
     The command alphabet is the largest, so this allocation will fit all
     alphabets. */
  uint8_t huffman_tree[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t huffman_tree_extra_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t huffman_tree_size = 0;
  uint8_t code_length_bitdepth[BROTLI_CODE_LENGTH_CODES] = { 0 };
  uint16_t code_length_bitdepth_symbols[BROTLI_CODE_LENGTH_CODES];
  uint32_t huffman_tree_histogram[BROTLI_CODE_LENGTH_CODES] = { 0 };
  size_t i;
  int num_codes = 0;
  size_t code = 0;

  assert(num <= BROTLI_NUM_COMMAND_SYMBOLS);

  BrotliWriteHuffmanTree(depths, num, &huffman_tree_size, huffman_tree,
                         huffman_tree_extra_bits);

  /* Calculate the statistics of the Huffman tree in brotli-representation. */
  for (i = 0; i < huffman_tree_size; ++i) {
    ++huffman_tree_histogram[huffman_tree[i]];
  }

  for (i = 0; i < BROTLI_CODE_LENGTH_CODES; ++i) {
    if (huffman_tree_histogram[i]) {
      if (num_codes == 0) {
        code = i;
        num_codes = 1;
      } else if (num_codes == 1) {
        num_codes = 2;
        break;
      }
    }
  }

  /* Calculate another Huffman tree to use for compressing both the
     earlier Huffman tree with. */
  BrotliCreateHuffmanTree(huffman_tree_histogram, BROTLI_CODE_LENGTH_CODES,
                          5, tree, code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,
                                  BROTLI_CODE_LENGTH_CODES,
                                  code_length_bitdepth_symbols);

  /* Now, we have all the data, let's start storing it */
  BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(num_codes, code_length_bitdepth,
                                               storage_ix, storage);

  if (num_codes == 1) {
    code_length_bitdepth[code] = 0;
  }

  /* Store the real Huffman tree now. */
  BrotliStoreHuffmanTreeToBitMask(huffman_tree_size,
                                  huffman_tree,
                                  huffman_tree_extra_bits,
                                  code_length_bitdepth,
                                  code_length_bitdepth_symbols,
                                  storage_ix, storage);
}